

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_OnlyTarget(void)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  bool bVar2;
  char *targetName;
  ModelDescription *pMVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  FeatureType *pFVar5;
  FeatureDescription *this;
  ArrayFeatureType *this_00;
  reference from;
  ostream *poVar6;
  Result local_228;
  FeatureDescription *trainingInputModel;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  int i;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  Result local_190;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInput;
  _Rb_tree_node_base _Stack_150;
  size_t sStack_130;
  set<long,_std::less<long>,_std::allocator<long>_> local_128;
  set<long,_std::less<long>,_std::allocator<long>_> local_f8;
  allocator local_c1;
  string local_c0;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_57e1f;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_57e36;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)&tensorAttributesOut.dimension,
             (TensorAttributes *)&neuralNet,0x400,false,false);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  local_c0._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::Model::mutable_neuralnetwork((Model *)(local_68 + 0x28));
  addSoftmaxLayer((Model *)(local_68 + 0x28),"softmax","OutTensor","softmax_out");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"cce_target",&local_c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  _Var1._M_storage = local_c0._M_storage._M_storage;
  targetName = (char *)std::__cxx11::string::c_str();
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)(local_68 + 0x28),(NeuralNetwork *)_Var1._M_storage,"cross_entropy_loss_layer"
             ,"softmax_out",targetName);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)local_c0._M_storage._M_storage,kSgdOptimizer,0.699999988079071,0.0,1.0
            );
  _Var1._M_storage = local_c0._M_storage._M_storage;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_f8._M_t._M_impl._0_8_ = 0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_f8);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,kSgdOptimizer,10,5,100,&local_f8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_f8);
  _Var1._M_storage = local_c0._M_storage._M_storage;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._M_t._M_impl._0_8_ = 0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_128);
  addEpochs<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,100,1,100,&local_128);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_128);
  _Var1._M_storage = local_c0._M_storage._M_storage;
  _Stack_150._M_right = (_Base_ptr)0x0;
  sStack_130 = 0;
  _Stack_150._M_parent = (_Base_ptr)0x0;
  _Stack_150._M_left = (_Base_ptr)0x0;
  trainingInput = (FeatureDescription *)0x0;
  _Stack_150._M_color = _S_red;
  _Stack_150._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&trainingInput);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar3);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
  trainingInputTensorShape =
       (ArrayFeatureType *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)trainingInputTensorShape,&local_c0);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)trainingInputTensorShape);
  local_190.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)local_190.m_message._M_storage._M_storage,
             ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape
            ((ArrayFeatureType *)local_190.m_message._M_storage._M_storage,1);
  CoreML::Model::validate(&local_190,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,&local_190);
  CoreML::Result::~Result(&local_190);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5ca);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    CoreML::Specification::ModelDescription::clear_output(pMVar3);
    pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    this = CoreML::Specification::ModelDescription::add_output(pMVar3);
    CoreML::Specification::FeatureDescription::set_name(this,(char *)neuralNet);
    pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(this);
    this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (this_00,ArrayFeatureType_ArrayDataType_FLOAT32);
    for (__range1._4_4_ = 0; __range1._4_4_ < (int)tensorAttributesOut.name;
        __range1._4_4_ = __range1._4_4_ + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
    }
    pMVar3 = CoreML::Specification::Model::description((Model *)(local_68 + 0x28));
    pRVar4 = CoreML::Specification::ModelDescription::input(pMVar3);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar4);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar4);
    while( true ) {
      bVar2 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                        (&__end1,(iterator *)&feature._cached_size_);
      if (!bVar2) break;
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInputModel,from);
      pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
      pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
      local_228.m_message._M_storage._M_storage =
           (uchar  [8])
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (pRVar4);
      CoreML::Specification::FeatureDescription::CopyFrom
                ((FeatureDescription *)local_228.m_message._M_storage._M_storage,
                 (FeatureDescription *)&trainingInputModel);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInputModel);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
    }
    CoreML::Model::validate(&local_228,(Model *)(local_68 + 0x28));
    CoreML::Result::operator=((Result *)local_68,&local_228);
    CoreML::Result::~Result(&local_228);
    bVar2 = CoreML::Result::good((Result *)local_68);
    if (bVar2) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5db);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"(res).good()");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_c0);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_OnlyTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);    return 0;
}